

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O2

BOOL __thiscall
Js::RecyclableObject::Equals
          (RecyclableObject *this,Var aRight,BOOL *value,ScriptContext *requestContext)

{
  ulong uVar1;
  long lVar2;
  PropertyRecord *pPVar3;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  int32 iVar7;
  uint uVar8;
  undefined4 *puVar9;
  RecyclableObject *pRVar10;
  RecyclableObject *pRVar11;
  JavascriptTypedNumber<unsigned_long> *pJVar12;
  JavascriptTypedNumber<long> *pJVar13;
  JavascriptBoolean *pJVar14;
  JavascriptString *aLeft;
  JavascriptString *aRight_00;
  JavascriptSymbol *pJVar15;
  JavascriptSymbolObject *pJVar16;
  PropertyRecord *pPVar17;
  char *message;
  ulong uVar18;
  char *error;
  Type TVar19;
  uint lineNumber;
  Type TVar20;
  Type TVar21;
  int iVar22;
  double dVar23;
  double local_48;
  RecyclableObject *local_38;
  
  if (this == (RecyclableObject *)aRight) {
    *value = 1;
    return 1;
  }
  TVar21 = ((this->type).ptr)->typeId;
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar5) goto LAB_00c585d8;
    *puVar9 = 0;
  }
  bVar5 = TaggedInt::Is(aRight);
  TVar20 = TypeIds_FirstNumberType;
  if ((!bVar5) && (TVar20 = TypeIds_Number, aRight < (Var)0x4000000000000)) {
    pRVar10 = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (pRVar10 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00c585d8;
      *puVar9 = 0;
    }
    TVar20 = ((pRVar10->type).ptr)->typeId;
    if ((0x57 < (int)TVar20) && (BVar6 = IsExternal(pRVar10), BVar6 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar5) {
LAB_00c585d8:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar9 = 0;
    }
  }
  iVar22 = 0;
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  pRVar10 = this;
  local_38 = (RecyclableObject *)aRight;
LAB_00c57d8e:
  iVar22 = iVar22 + 1;
  if (iVar22 == 3) {
switchD_00c57fa1_caseD_0:
    *value = 0;
    return 1;
  }
  switch(TVar21) {
  case TypeIds_Undefined:
  case TypeIds_Null:
    if (TVar20 < TypeIds_BigInt) {
      if ((0x118U >> (TVar20 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0)
      goto switchD_00c57fa1_caseD_0;
      if ((3U >> (TVar20 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0) {
        *value = 1;
        return 1;
      }
    }
    this = VarTo<Js::RecyclableObject>(local_38);
    goto LAB_00c58302;
  case TypeIds_Boolean:
    if (TVar20 < TypeIds_BigInt) {
      if ((0x98U >> (TVar20 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0) {
LAB_00c5832c:
        local_48 = JavascriptConversion::ToNumber(pRVar10,requestContext);
        goto LAB_00c5835e;
      }
      if ((0x103U >> (TVar20 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0)
      goto switchD_00c57fa1_caseD_0;
      if (TVar20 == TypeIds_Boolean) {
        pJVar14 = VarTo<Js::JavascriptBoolean>(pRVar10);
        iVar22 = pJVar14->value;
        pJVar14 = VarTo<Js::JavascriptBoolean>(local_38);
        bVar5 = iVar22 == pJVar14->value;
        goto LAB_00c581f0;
      }
    }
    break;
  case TypeIds_FirstNumberType:
    switch(TVar20) {
    case TypeIds_Undefined:
    case TypeIds_Null:
    case TypeIds_Symbol:
      goto switchD_00c57fa1_caseD_0;
    case TypeIds_Boolean:
    case TypeIds_String:
      local_48 = (double)(int)pRVar10;
LAB_00c5835e:
      dVar23 = JavascriptConversion::ToNumber(local_38,requestContext);
LAB_00c5836c:
      *value = (uint)(local_48 == dVar23);
      return 1;
    case TypeIds_FirstNumberType:
      uVar8 = (uint)(pRVar10 == local_38);
      goto LAB_00c5830d;
    case TypeIds_Number:
      local_48 = (double)(int)pRVar10;
LAB_00c582ce:
      dVar23 = JavascriptNumber::GetValue(local_38);
      goto LAB_00c5836c;
    case TypeIds_Int64Number:
      iVar7 = TaggedInt::ToInt32(pRVar10);
      pJVar13 = VarTo<Js::JavascriptTypedNumber<long>>(local_38);
      bVar5 = pJVar13->m_value == (long)iVar7;
      *value = (uint)bVar5;
      if (!bVar5) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      error = "(!(*value))";
      message = "!(*value)";
      lineNumber = 0x23b;
      break;
    case TypeIds_LastNumberType:
      iVar7 = TaggedInt::ToInt32(pRVar10);
      pJVar13 = VarTo<Js::JavascriptTypedNumber<long>>(local_38);
      bVar5 = pJVar13->m_value == (long)iVar7;
      *value = (uint)bVar5;
      if (!bVar5) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      error = "(!(*value))";
      message = "!(*value)";
      lineNumber = 0x244;
      break;
    default:
      goto switchD_00c57fa1_caseD_5;
    }
    goto LAB_00c582ab;
  case TypeIds_Number:
    switch(TVar20) {
    case TypeIds_Undefined:
    case TypeIds_Null:
    case TypeIds_Symbol:
      goto switchD_00c57fa1_caseD_0;
    case TypeIds_Boolean:
    case TypeIds_String:
      local_48 = JavascriptNumber::GetValue(pRVar10);
      goto LAB_00c5835e;
    case TypeIds_FirstNumberType:
      local_48 = JavascriptNumber::GetValue(pRVar10);
      dVar23 = (double)(int)local_38;
      goto LAB_00c5836c;
    case TypeIds_Number:
      local_48 = JavascriptNumber::GetValue(pRVar10);
      goto LAB_00c582ce;
    }
    break;
  case TypeIds_Int64Number:
    switch(TVar20) {
    case TypeIds_FirstNumberType:
      pJVar13 = VarTo<Js::JavascriptTypedNumber<long>>(pRVar10);
      lVar2 = pJVar13->m_value;
      iVar7 = TaggedInt::ToInt32(local_38);
      bVar5 = lVar2 == iVar7;
      *value = (uint)bVar5;
      if (!bVar5) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      error = "(!(*value))";
      message = "!(*value)";
      lineNumber = 0x25c;
      goto LAB_00c582ab;
    case TypeIds_Number:
      pJVar13 = VarTo<Js::JavascriptTypedNumber<long>>(pRVar10);
      local_48 = (double)pJVar13->m_value;
      goto LAB_00c582ce;
    case TypeIds_Int64Number:
    case TypeIds_LastNumberType:
      pJVar12 = (JavascriptTypedNumber<unsigned_long> *)
                VarTo<Js::JavascriptTypedNumber<long>>(pRVar10);
LAB_00c581c6:
      TVar19 = pJVar12->m_value;
      pJVar12 = (JavascriptTypedNumber<unsigned_long> *)
                VarTo<Js::JavascriptTypedNumber<long>>(local_38);
LAB_00c581ea:
      bVar5 = TVar19 == pJVar12->m_value;
LAB_00c581f0:
      *value = (uint)bVar5;
      return 1;
    }
switchD_00c580ff_default:
    pRVar10 = (RecyclableObject *)
              JavascriptConversion::ToPrimitive<(Js::JavascriptHint)0>(pRVar10,requestContext);
    if (pRVar10 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (bVar5) {
        *puVar9 = 0;
        goto LAB_00c57e42;
      }
      goto LAB_00c585d8;
    }
LAB_00c57e42:
    bVar5 = TaggedInt::Is(pRVar10);
    TVar21 = TypeIds_FirstNumberType;
    if ((!bVar5) && (TVar21 = TypeIds_Number, pRVar10 < (RecyclableObject *)0x4000000000000)) {
      pRVar11 = UnsafeVarTo<Js::RecyclableObject>(pRVar10);
      if (pRVar11 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar5) goto LAB_00c585d8;
        *puVar9 = 0;
      }
      TVar21 = ((pRVar11->type).ptr)->typeId;
      if ((0x57 < (int)TVar21) && (BVar6 = IsExternal(pRVar11), BVar6 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
LAB_00c57ef3:
        *puVar9 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar5) goto LAB_00c585d8;
        *puVar9 = 0;
      }
    }
    goto LAB_00c57d8e;
  case TypeIds_LastNumberType:
    switch(TVar20) {
    case TypeIds_FirstNumberType:
      pJVar12 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(pRVar10);
      TVar19 = pJVar12->m_value;
      iVar7 = TaggedInt::ToInt32(local_38);
      bVar5 = TVar19 == (long)iVar7;
      *value = (uint)(bVar5 && -1 < iVar7);
      if (!bVar5 || -1 >= iVar7) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      error = "(!(*value))";
      message = "!(*value)";
      lineNumber = 0x27d;
      break;
    case TypeIds_Number:
      pJVar12 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(pRVar10);
      uVar1 = pJVar12->m_value;
      uVar18 = (ulong)((uint)uVar1 & 1) | uVar1 >> 1;
      if (-1 < (long)uVar1) {
        uVar18 = uVar1;
      }
      dVar23 = (double)(long)uVar18;
      local_48 = dVar23 + dVar23;
      if (-1 < (long)uVar1) {
        local_48 = dVar23;
      }
      dVar23 = JavascriptNumber::GetValue(local_38);
      goto LAB_00c5836c;
    case TypeIds_Int64Number:
      pJVar12 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(pRVar10);
      goto LAB_00c581c6;
    case TypeIds_LastNumberType:
      pJVar12 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(pRVar10);
      TVar19 = pJVar12->m_value;
      pJVar12 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(local_38);
      goto LAB_00c581ea;
    default:
      goto switchD_00c580ff_default;
    }
    goto LAB_00c582ab;
  case TypeIds_String:
    if (TVar20 < TypeIds_BigInt) {
      if ((0x1cU >> (TVar20 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0) goto LAB_00c5832c;
      if ((0x103U >> (TVar20 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0)
      goto switchD_00c57fa1_caseD_0;
      if (TVar20 == TypeIds_String) {
        aLeft = UnsafeVarTo<Js::JavascriptString>(pRVar10);
        aRight_00 = UnsafeVarTo<Js::JavascriptString>(local_38);
        bVar5 = JavascriptString::Equals(aLeft,aRight_00);
        uVar8 = (uint)bVar5;
        goto LAB_00c5830d;
      }
    }
    break;
  case TypeIds_Symbol:
    if ((TVar20 < TypeIds_Int64Number) || (TVar20 == TypeIds_String)) goto switchD_00c57fa1_caseD_0;
    if (TVar20 == TypeIds_SymbolObject) {
      pJVar16 = UnsafeVarTo<Js::JavascriptSymbolObject>(local_38);
      pRVar11 = (RecyclableObject *)JavascriptSymbolObject::Unwrap(pJVar16);
      *value = (uint)(pRVar10 == pRVar11);
      pJVar15 = UnsafeVarTo<Js::JavascriptSymbol>(pRVar10);
      pPVar3 = (pJVar15->propertyRecordUsageCache).propertyRecord.ptr;
      pJVar16 = UnsafeVarTo<Js::JavascriptSymbolObject>(local_38);
      pJVar15 = (pJVar16->value).ptr;
      if (pJVar15 == (JavascriptSymbol *)0x0) {
        pPVar17 = (PropertyRecord *)0x0;
      }
      else {
        pPVar17 = (pJVar15->propertyRecordUsageCache).propertyRecord.ptr;
      }
      if (*value == (uint)(pPVar3 == pPVar17)) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      error = 
      "((UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbolObject>(aRight)->GetValue()) == *value)"
      ;
      message = 
      "(UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbolObject>(aRight)->GetValue()) == *value"
      ;
      lineNumber = 0x2e5;
    }
    else {
      if (TVar20 != TypeIds_Symbol) break;
      *value = (uint)(pRVar10 == local_38);
      pJVar15 = UnsafeVarTo<Js::JavascriptSymbol>(pRVar10);
      pPVar3 = (pJVar15->propertyRecordUsageCache).propertyRecord.ptr;
      pJVar15 = UnsafeVarTo<Js::JavascriptSymbol>(local_38);
      if (*value == (uint)(pPVar3 == (pJVar15->propertyRecordUsageCache).propertyRecord.ptr)) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      error = 
      "((UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbol>(aRight)->GetValue()) == *value)"
      ;
      message = 
      "(UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbol>(aRight)->GetValue()) == *value"
      ;
      lineNumber = 0x2e1;
    }
LAB_00c582ab:
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                ,lineNumber,error,message);
    if (bVar5) {
      *puVar9 = 0;
      return 1;
    }
    goto LAB_00c585d8;
  default:
    if (TVar20 < TypeIds_BigInt) {
      if ((0x19cU >> (TVar20 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0)
      goto switchD_00c580ff_default;
      if ((3U >> (TVar20 & TypeIds_CopyOnAccessNativeIntArray) & 1) != 0) {
LAB_00c58302:
        uVar8 = ((this->type).ptr)->flags & 2;
LAB_00c5830d:
        *value = uVar8;
        return 1;
      }
    }
    goto switchD_00c57fa1_caseD_0;
  }
switchD_00c57fa1_caseD_5:
  local_38 = (RecyclableObject *)
             JavascriptConversion::ToPrimitive<(Js::JavascriptHint)0>(local_38,requestContext);
  if (local_38 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar9 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar5) goto LAB_00c585d8;
    *puVar9 = 0;
  }
  bVar5 = TaggedInt::Is(local_38);
  TVar20 = TypeIds_FirstNumberType;
  if ((!bVar5) && (TVar20 = TypeIds_Number, local_38 < (RecyclableObject *)0x4000000000000)) {
    pRVar11 = UnsafeVarTo<Js::RecyclableObject>(local_38);
    if (pRVar11 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00c585d8;
      *puVar9 = 0;
    }
    TVar20 = ((pRVar11->type).ptr)->typeId;
    if ((0x57 < (int)TVar20) && (BVar6 = IsExternal(pRVar11), BVar6 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      goto LAB_00c57ef3;
    }
  }
  goto LAB_00c57d8e;
}

Assistant:

BOOL RecyclableObject::Equals(__in Var aRight, __out BOOL* value, ScriptContext * requestContext)
    {
        Var aLeft = this;
        if (aLeft == aRight)
        {
            *value = TRUE;
            return TRUE;
        }

        double dblLeft, dblRight;
        TypeId leftType = this->GetTypeId();
        TypeId rightType = JavascriptOperators::GetTypeId(aRight);
        int redoCount = 0;

    Redo:
        if (redoCount == 2)
        {
            goto ReturnFalse;
        }

        switch (leftType)
        {
        case TypeIds_Undefined:
        case TypeIds_Null:
            switch (rightType)
            {
            case TypeIds_Integer:
            case TypeIds_Number:
            case TypeIds_Symbol:
                goto ReturnFalse;
            case TypeIds_Undefined:
            case TypeIds_Null:
                goto ReturnTrue;
            default:
                // Falsy objects are == null and == undefined.
                *value = VarTo<RecyclableObject>(aRight)->GetType()->IsFalsy();
                return TRUE;
            }
        case TypeIds_Integer:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
            case TypeIds_Symbol:
                goto ReturnFalse;
            case TypeIds_Integer:
                // We already did a check to see if aLeft == aRight above, but we need to check again in case there was a redo.
                *value = aLeft == aRight;
                return TRUE;
            case TypeIds_Int64Number:
            {
                int leftValue = TaggedInt::ToInt32(aLeft);
                __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                *value = leftValue == rightValue;
                Assert(!(*value));  // currently it cannot be true. more for future extension if we allow arithmetic calculation
                return TRUE;
            }
            case TypeIds_UInt64Number:
            {
                __int64 leftValue = TaggedInt::ToInt32(aLeft);
                unsigned __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                // TODO: yongqu to review whether we need to check for neg value
                *value = (/*leftValue >= 0 && */(unsigned __int64)leftValue == rightValue);
                Assert(!(*value));  // currently it cannot be true. more for future extension if we allow arithmetic calculation
                return TRUE;
            }
            case TypeIds_Number:
                dblLeft = TaggedInt::ToDouble(aLeft);
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CompareDoubles;
            case TypeIds_Boolean:
            case TypeIds_String:
                dblLeft = TaggedInt::ToDouble(aLeft);
                dblRight = JavascriptConversion::ToNumber(aRight, requestContext);
                goto CompareDoubles;
            default:
                goto RedoRight;
            }
            break;
        case TypeIds_Int64Number:
            switch (rightType)
            {
            case TypeIds_Integer:
            {
                __int64 leftValue = VarTo<JavascriptInt64Number>(aLeft)->GetValue();
                int rightValue = TaggedInt::ToInt32(aRight);
                *value = leftValue == rightValue;
                Assert(!(*value));  // currently it cannot be true. more for future extension if we allow arithmetic calculation
                return TRUE;
            }
            case TypeIds_Number:
                dblLeft = (double)VarTo<JavascriptInt64Number>(aLeft)->GetValue();
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CompareDoubles;
            case TypeIds_Int64Number:
            {
                __int64 leftValue = VarTo<JavascriptInt64Number>(aLeft)->GetValue();
                __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                *value = leftValue == rightValue;
                return TRUE;
            }
            case TypeIds_UInt64Number:
            {
                __int64 leftValue = VarTo<JavascriptInt64Number>(aLeft)->GetValue();
                unsigned __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                // TODO: yongqu to review whether we need to check for neg value
                *value = (/* leftValue >= 0 && */(unsigned __int64)leftValue == rightValue);
                return TRUE;
            }
            }
            break;
        case TypeIds_UInt64Number:
            switch (rightType)
            {
            case TypeIds_Integer:
            {
                unsigned __int64 leftValue = VarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                __int64 rightValue = TaggedInt::ToInt32(aRight);
                // TODO: yongqu to review whether we need to check for neg value
                *value = rightValue >= 0 && leftValue == (unsigned __int64)rightValue;
                Assert(!(*value));  // currently it cannot be true. more for future extension if we allow arithmetic calculation
                return TRUE;
            }
            case TypeIds_Number:
                dblLeft = (double)VarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CompareDoubles;
            case TypeIds_Int64Number:
            {
                unsigned __int64 leftValue = VarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                // TODO: yongqu to review whether we need to check for neg value
                *value = (/* rightValue >= 0 && */leftValue == (unsigned __int64)rightValue);
                return TRUE;
            }
            case TypeIds_UInt64Number:
            {
                unsigned __int64 leftValue = VarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                unsigned __int64 rightValue = VarTo<JavascriptUInt64Number>(aRight)->GetValue();
                *value = leftValue == rightValue;
                return TRUE;
            }
            }
            break;
        case TypeIds_Number:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
            case TypeIds_Symbol:
                goto ReturnFalse;
            case TypeIds_Integer:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = TaggedInt::ToDouble(aRight);
                goto CompareDoubles;
            case TypeIds_Number:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CompareDoubles;
            case TypeIds_Boolean:
            case TypeIds_String:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = JavascriptConversion::ToNumber(aRight, requestContext);
                goto CompareDoubles;
            default:
                goto RedoRight;
            }
            break;
        case TypeIds_String:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
            case TypeIds_Symbol:
                goto ReturnFalse;
            case TypeIds_String:
                *value = JavascriptString::Equals(UnsafeVarTo<JavascriptString>(aLeft), UnsafeVarTo<JavascriptString>(aRight));
                return TRUE;
            case TypeIds_Number:
            case TypeIds_Integer:
            case TypeIds_Boolean:
                dblLeft = JavascriptConversion::ToNumber(aLeft, requestContext);
                dblRight = JavascriptConversion::ToNumber(aRight, requestContext);
                goto CompareDoubles;
            default:
                goto RedoRight;
            }
        case TypeIds_Boolean:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
            case TypeIds_Symbol:
                goto ReturnFalse;
            case TypeIds_Boolean:
                *value = VarTo<JavascriptBoolean>(aLeft)->GetValue() == VarTo<JavascriptBoolean>(aRight)->GetValue();
                return TRUE;
            case TypeIds_Number:
            case TypeIds_Integer:
            case TypeIds_String:
                dblLeft = JavascriptConversion::ToNumber(aLeft, requestContext);
                dblRight = JavascriptConversion::ToNumber(aRight, requestContext);
                goto CompareDoubles;
            default:
                goto RedoRight;
            }
            break;

        case TypeIds_Symbol:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
            case TypeIds_Number:
            case TypeIds_Integer:
            case TypeIds_String:
            case TypeIds_Boolean:
                goto ReturnFalse;
            case TypeIds_Symbol:
                *value = (aLeft == aRight);
                Assert((UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbol>(aRight)->GetValue()) == *value);
                return TRUE;
            case TypeIds_SymbolObject:
                *value = (aLeft == UnsafeVarTo<JavascriptSymbolObject>(aRight)->Unwrap());
                Assert((UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbolObject>(aRight)->GetValue()) == *value);
                return TRUE;
            default:
                goto RedoRight;
            }
            break;

        case TypeIds_Function:
            if (rightType == TypeIds_Function)
            {
                goto ReturnFalse;
            }
            // Fall through to do normal object comparison on function object.
        default:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
                // Falsy objects are == null and == undefined.
                *value = this->type->IsFalsy();
                return TRUE;
            case TypeIds_Boolean:
            case TypeIds_Integer:
            case TypeIds_Number:
            case TypeIds_String:
            case TypeIds_Symbol:
                goto RedoLeft;
            default:
                goto ReturnFalse;
            }
        }

    RedoLeft:
        aLeft = JavascriptConversion::ToPrimitive<JavascriptHint::None>(aLeft, requestContext);
        leftType = JavascriptOperators::GetTypeId(aLeft);
        redoCount++;
        goto Redo;
    RedoRight:
        aRight = JavascriptConversion::ToPrimitive<JavascriptHint::None>(aRight, requestContext);
        rightType = JavascriptOperators::GetTypeId(aRight);
        redoCount++;
        goto Redo;
    CompareDoubles:
        *value = dblLeft == dblRight;
        return TRUE;
    ReturnFalse:
        *value = FALSE;
        return TRUE;
    ReturnTrue:
        *value = TRUE;
        return TRUE;
    }